

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

Vec_Ptr_t * Llb_ManCutSupp(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pObj_00;
  int local_3c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vSupp;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vUpper_local;
  Vec_Ptr_t *vLower_local;
  Aig_Man_t *p_local;
  
  pVVar2 = Llb_ManCutNodes(p,vLower,vUpper);
  Aig_ManIncrementTravId(p);
  local_3c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(pVVar2);
    if (iVar1 <= local_3c) {
      Vec_PtrFree(pVVar2);
      pVVar2 = Vec_PtrAlloc(100);
      for (local_3c = 0; iVar1 = Vec_PtrSize(vLower), local_3c < iVar1; local_3c = local_3c + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(vLower,local_3c);
        iVar1 = Aig_ObjIsTravIdCurrent(p,pAVar3);
        if (iVar1 != 0) {
          Vec_PtrPush(pVVar2,pAVar3);
        }
      }
      return pVVar2;
    }
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar2,local_3c);
    iVar1 = Aig_ObjIsNode(pAVar3);
    if (iVar1 == 0) break;
    pObj_00 = Aig_ObjFanin0(pAVar3);
    Aig_ObjSetTravIdCurrent(p,pObj_00);
    pAVar3 = Aig_ObjFanin1(pAVar3);
    Aig_ObjSetTravIdCurrent(p,pAVar3);
    local_3c = local_3c + 1;
  }
  __assert_fail("Aig_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb2Flow.c"
                ,0x19b,"Vec_Ptr_t *Llb_ManCutSupp(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

Vec_Ptr_t * Llb_ManCutSupp( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper )
{
    Vec_Ptr_t * vNodes, * vSupp;
    Aig_Obj_t * pObj;
    int i;
    vNodes = Llb_ManCutNodes( p, vLower, vUpper );
    // mark support of the nodes
    Aig_ManIncrementTravId(p);
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        Aig_ObjSetTravIdCurrent( p, Aig_ObjFanin0(pObj) );
        Aig_ObjSetTravIdCurrent( p, Aig_ObjFanin1(pObj) );
    }
    Vec_PtrFree( vNodes );
    // collect the support nodes
    vSupp = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        if ( Aig_ObjIsTravIdCurrent(p, pObj) )
            Vec_PtrPush( vSupp, pObj );
    return vSupp;

}